

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_getBank(ADL_MIDIPlayer *device,ADL_BankId *idp,int flags,ADL_Bank *bank)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ushort uVar3;
  bool bVar4;
  OPL3 *pOVar5;
  ulong uVar6;
  pair<BasicBankMap<OPL3::Bank>::iterator,_bool> local_14a8;
  iterator local_1488;
  Slot **local_1468;
  Slot **local_1460;
  Slot *local_1458;
  undefined1 local_1450;
  undefined1 local_1448 [8];
  pair<BasicBankMap<OPL3::Bank>::iterator,_bool> ir;
  undefined1 auStack_1420 [4];
  uint i;
  pair<unsigned_long,_OPL3::Bank> value;
  iterator local_80;
  undefined1 local_68 [8];
  iterator it;
  BankMap *map;
  MidiPlayer *play;
  size_t idnumber;
  ADL_BankId id;
  ADL_Bank *bank_local;
  int flags_local;
  ADL_BankId *idp_local;
  ADL_MIDIPlayer *device_local;
  
  if (((device == (ADL_MIDIPlayer *)0x0) || (idp == (ADL_BankId *)0x0)) || (bank == (ADL_Bank *)0x0)
     ) {
    device_local._4_4_ = -1;
  }
  else {
    uVar1 = idp->percussive;
    uVar2 = idp->msb;
    if (((idp->lsb < 0x80) && ((byte)uVar2 < 0x80)) && ((byte)uVar1 < 2)) {
      uVar3 = CONCAT11(uVar2,idp->lsb);
      uVar6 = 0;
      if (uVar1 != 0) {
        uVar6 = 0x8000;
      }
      if (device->adl_midiPlayer == (void *)0x0) {
        __assert_fail("play",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                      ,0x10d,
                      "int adl_getBank(ADL_MIDIPlayer *, const ADL_BankId *, int, ADL_Bank *)");
      }
      pOVar5 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator->
                         ((AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_> *)
                          ((long)device->adl_midiPlayer + 0x198));
      it.index = (size_t)&pOVar5->m_insBanks;
      BasicBankMap<OPL3::Bank>::iterator::iterator((iterator *)local_68);
      if ((flags & 1U) == 0) {
        BasicBankMap<OPL3::Bank>::find
                  (&local_80,(BasicBankMap<OPL3::Bank> *)it.index,(long)(int)(uint)uVar3 | uVar6);
        local_68 = (undefined1  [8])local_80.buckets;
        it.buckets = &(local_80.slot)->next;
        it.slot = (Slot *)local_80.index;
        BasicBankMap<OPL3::Bank>::end
                  ((iterator *)&value.second.ins[0x7f].voice2_fine_tune,
                   (BasicBankMap<OPL3::Bank> *)it.index);
        bVar4 = BasicBankMap<OPL3::Bank>::iterator::operator==
                          ((iterator *)local_68,(iterator *)&value.second.ins[0x7f].voice2_fine_tune
                          );
        if (bVar4) {
          return -1;
        }
      }
      else {
        std::pair<unsigned_long,_OPL3::Bank>::pair((pair<unsigned_long,_OPL3::Bank> *)auStack_1420);
        _auStack_1420 = (long)(int)(uint)uVar3 | uVar6;
        memset(&value,0,0x1380);
        for (ir._28_4_ = 0; (uint)ir._28_4_ < 0x80; ir._28_4_ = ir._28_4_ + 1) {
          *(undefined1 *)((long)&value.second.ins[(uint)ir._28_4_].op[1].carrier_E862 + 1) = 2;
        }
        std::pair<BasicBankMap<OPL3::Bank>::iterator,_bool>::pair
                  ((pair<BasicBankMap<OPL3::Bank>::iterator,_bool> *)local_1448);
        if ((flags & 3U) == 3) {
          BasicBankMap<OPL3::Bank>::insert
                    (&local_1468,(BasicBankMap<OPL3::Bank> *)it.index,auStack_1420);
          local_1448 = (undefined1  [8])local_1468;
          ir.first.buckets = local_1460;
          ir.first.slot = local_1458;
          ir.first.index._0_1_ = local_1450;
          BasicBankMap<OPL3::Bank>::end(&local_1488,(BasicBankMap<OPL3::Bank> *)it.index);
          bVar4 = BasicBankMap<OPL3::Bank>::iterator::operator==((iterator *)local_1448,&local_1488)
          ;
          if (bVar4) {
            return -1;
          }
        }
        else {
          BasicBankMap<OPL3::Bank>::insert
                    (&local_14a8,(BasicBankMap<OPL3::Bank> *)it.index,(value_type *)auStack_1420);
          local_1448 = (undefined1  [8])local_14a8.first.buckets;
          ir.first.buckets = &(local_14a8.first.slot)->next;
          ir.first.slot = (Slot *)local_14a8.first.index;
          ir.first.index._0_1_ = local_14a8.second;
        }
        local_68 = local_1448;
        it.buckets = ir.first.buckets;
        it.slot = ir.first.slot;
      }
      BasicBankMap<OPL3::Bank>::iterator::to_ptrs((iterator *)local_68,bank->pointer);
      device_local._4_4_ = 0;
    }
    else {
      device_local._4_4_ = -1;
    }
  }
  return device_local._4_4_;
}

Assistant:

ADLMIDI_EXPORT int adl_getBank(ADL_MIDIPlayer *device, const ADL_BankId *idp, int flags, ADL_Bank *bank)
{
    if(!device || !idp || !bank)
        return -1;

    ADL_BankId id = *idp;
    if(id.lsb > 127 || id.msb > 127 || id.percussive > 1)
        return -1;
    size_t idnumber = ((id.msb << 8) | id.lsb | (id.percussive ? size_t(Synth::PercussionTag) : 0));

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it;
    if(!(flags & ADLMIDI_Bank_Create))
    {
        it = map.find(idnumber);
        if(it == map.end())
            return -1;
    }
    else
    {
        std::pair<size_t, Synth::Bank> value;
        value.first = idnumber;
        memset(&value.second, 0, sizeof(value.second));
        for (unsigned i = 0; i < 128; ++i)
            value.second.ins[i].flags = OplInstMeta::Flag_NoSound;

        std::pair<Synth::BankMap::iterator, bool> ir;
        if((flags & ADLMIDI_Bank_CreateRt) == ADLMIDI_Bank_CreateRt)
        {
            ir = map.insert(value, Synth::BankMap::do_not_expand_t());
            if(ir.first == map.end())
                return -1;
        }
        else
            ir = map.insert(value);
        it = ir.first;
    }

    it.to_ptrs(bank->pointer);
    return 0;
}